

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O2

void __thiscall rengine::WorkQueue::~WorkQueue(WorkQueue *this)

{
  std::mutex::lock(&this->m_mutex);
  this->m_running = false;
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  std::thread::join();
  std::__cxx11::
  _List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ::_M_clear(&(this->m_jobs).
              super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
            );
  std::condition_variable::~condition_variable(&this->m_condition);
  std::thread::~thread(&this->m_thread);
  return;
}

Assistant:

inline WorkQueue::~WorkQueue()
{
    // Tell thread to exit..
    m_mutex.lock();
    m_running = false;
    m_condition.notify_one();
    m_mutex.unlock();

    // Wait for it to finish..
    m_thread.join();
}